

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_spacing.c
# Opt level: O0

unsigned_short XUtf8IsNonSpacing(uint ucs)

{
  unsigned_short local_a;
  uint ucs_local;
  
  if (ucs < 0x362) {
    if (ucs < 0x300) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_0300[ucs - 0x300];
    }
  }
  else if (ucs < 0x487) {
    if (ucs < 0x483) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_0483[ucs - 0x483];
    }
  }
  else if (ucs < 0x5c5) {
    if (ucs < 0x591) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_0591[ucs - 0x591];
    }
  }
  else if (ucs < 0x6ee) {
    if (ucs < 0x64b) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_064B[ucs - 0x64b];
    }
  }
  else if (ucs < 0xd4e) {
    if (ucs < 0x901) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_0901[ucs - 0x901];
    }
  }
  else if (ucs < 0xfba) {
    if (ucs < 0xe31) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_0E31[ucs - 0xe31];
    }
  }
  else if (ucs < 0x20e2) {
    if (ucs < 0x20d0) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_20D0[ucs - 0x20d0];
    }
  }
  else if (ucs < 0x309b) {
    if (ucs < 0x302a) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_302A[ucs - 0x302a];
    }
  }
  else if (ucs < 0xfb1f) {
    if (ucs < 0xfb1e) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_FB1E[ucs - 0xfb1e];
    }
  }
  else if (ucs < 0xfe24) {
    if (ucs < 0xfe20) {
      local_a = 0;
    }
    else {
      local_a = ucs_table_FE20[ucs - 0xfe20];
    }
  }
  else {
    local_a = 0;
  }
  return local_a;
}

Assistant:

unsigned short 
XUtf8IsNonSpacing(unsigned int ucs) {

  if (ucs <= 0x0361) {
    if (ucs >= 0x0300) return ucs_table_0300[ucs - 0x0300];
    return 0;
  }

  if (ucs <= 0x0486) {
    if (ucs >= 0x0483) return ucs_table_0483[ucs - 0x0483];
    return 0;
  }

  if (ucs <= 0x05C4) {
    if (ucs >= 0x0591) return ucs_table_0591[ucs - 0x0591];
    return 0;
  }

  if (ucs <= 0x06ED) {
    if (ucs >= 0x064B) return ucs_table_064B[ucs - 0x064B];
    return 0;
  }

  if (ucs <= 0x0D4D) {
    if (ucs >= 0x0901) return ucs_table_0901[ucs - 0x0901];
    return 0;
  }

  if (ucs <= 0x0FB9) {
    if (ucs >= 0x0E31) return ucs_table_0E31[ucs - 0x0E31];
    return 0;
  }

  if (ucs <= 0x20E1) {
    if (ucs >= 0x20D0) return ucs_table_20D0[ucs - 0x20D0];
    return 0;
  }

  if (ucs <= 0x309A) {
    if (ucs >= 0x302A) return ucs_table_302A[ucs - 0x302A];
    return 0;
  }

  if (ucs <= 0xFB1E) {
    if (ucs >= 0xFB1E) return ucs_table_FB1E[ucs - 0xFB1E];
    return 0;
  }

  if (ucs <= 0xFE23) {
    if (ucs >= 0xFE20) return ucs_table_FE20[ucs - 0xFE20];
    return 0;
  }

  return 0;
}